

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall AsymmetricAlgorithm::verifyFinal(AsymmetricAlgorithm *this,ByteString *param_1)

{
  anon_enum_32 aVar1;
  
  aVar1 = this->currentOperation;
  if (aVar1 == VERIFY) {
    this->currentOperation = NONE;
    this->currentPublicKey = (PublicKey *)0x0;
    this->currentMechanism = Unknown;
  }
  return aVar1 == VERIFY;
}

Assistant:

bool AsymmetricAlgorithm::verifyFinal(const ByteString& /*signature*/)
{
	if (currentOperation != VERIFY)
	{
		return false;
	}

	currentOperation = NONE;
	currentPublicKey = NULL;
	currentMechanism = AsymMech::Unknown;

	return true;
}